

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall leveldb::VersionSet::Builder::SaveTo(Builder *this,Version *v)

{
  VersionSet *pVVar1;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  __last;
  FileSet *pFVar2;
  pointer ppFVar3;
  FileMetaData *pFVar4;
  FileMetaData *pFVar5;
  FILE *__stream;
  int iVar6;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  _Var7;
  _Base_ptr p_Var8;
  uint uVar9;
  uint uVar10;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  __first;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  long lVar11;
  string local_70;
  string local_50;
  
  pVVar1 = this->vset_;
  lVar11 = 0;
  do {
    if (lVar11 == 7) {
      return;
    }
    __first._M_current =
         this->base_->files_[lVar11].
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         this->base_->files_[lVar11].
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    pFVar2 = this->levels_[lVar11].added_files;
    this_00 = v->files_ + lVar11;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
              (this_00,((long)__last._M_current - (long)__first._M_current >> 3) +
                       (pFVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
    for (p_Var8 = (pFVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        iVar6 = (int)lVar11,
        (_Rb_tree_header *)p_Var8 != &(pFVar2->_M_t)._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      _Var7 = std::
              __upper_bound<__gnu_cxx::__normal_iterator<leveldb::FileMetaData*const*,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,leveldb::FileMetaData*,__gnu_cxx::__ops::_Val_comp_iter<leveldb::VersionSet::Builder::BySmallestKey>>
                        (__first,__last,(FileMetaData **)(p_Var8 + 1),
                         (_Val_comp_iter<leveldb::VersionSet::Builder::BySmallestKey>)&pVVar1->icmp_
                        );
      for (; __first._M_current != _Var7._M_current; __first._M_current = __first._M_current + 1) {
        MaybeAddFile(this,v,iVar6,*__first._M_current);
      }
      MaybeAddFile(this,v,iVar6,*(FileMetaData **)(p_Var8 + 1));
    }
    for (; __first._M_current != __last._M_current; __first._M_current = __first._M_current + 1) {
      MaybeAddFile(this,v,iVar6,*__first._M_current);
    }
    if (lVar11 != 0) {
      uVar9 = 0;
      while( true ) {
        uVar10 = uVar9 + 1;
        ppFVar3 = (this_00->
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this_00->
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 >> 3) <=
            (ulong)uVar10) break;
        pFVar4 = ppFVar3[uVar9];
        pFVar5 = ppFVar3[uVar10];
        iVar6 = InternalKeyComparator::Compare
                          (&this->vset_->icmp_,&pFVar4->largest,&pFVar5->smallest);
        __stream = _stderr;
        uVar9 = uVar10;
        if (-1 < iVar6) {
          InternalKey::DebugString_abi_cxx11_(&local_70,&pFVar4->largest);
          InternalKey::DebugString_abi_cxx11_(&local_50,&pFVar5->smallest);
          fprintf(__stream,"overlapping ranges in same level %s vs. %s\n",local_70._M_dataplus._M_p,
                  local_50._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          abort();
        }
      }
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

void SaveTo(Version* v) {
    BySmallestKey cmp;
    cmp.internal_comparator = &vset_->icmp_;
    for (int level = 0; level < config::kNumLevels; level++) {
      // Merge the set of added files with the set of pre-existing files.
      // Drop any deleted files.  Store the result in *v.
      const std::vector<FileMetaData*>& base_files = base_->files_[level];
      std::vector<FileMetaData*>::const_iterator base_iter = base_files.begin();
      std::vector<FileMetaData*>::const_iterator base_end = base_files.end();
      const FileSet* added_files = levels_[level].added_files;
      v->files_[level].reserve(base_files.size() + added_files->size());
      for (const auto& added_file : *added_files) {
        // Add all smaller files listed in base_
        for (std::vector<FileMetaData*>::const_iterator bpos =
                 std::upper_bound(base_iter, base_end, added_file, cmp);
             base_iter != bpos; ++base_iter) {
          MaybeAddFile(v, level, *base_iter);
        }

        MaybeAddFile(v, level, added_file);
      }

      // Add remaining base files
      for (; base_iter != base_end; ++base_iter) {
        MaybeAddFile(v, level, *base_iter);
      }

#ifndef NDEBUG
      // Make sure there is no overlap in levels > 0
      if (level > 0) {
        for (uint32_t i = 1; i < v->files_[level].size(); i++) {
          const InternalKey& prev_end = v->files_[level][i - 1]->largest;
          const InternalKey& this_begin = v->files_[level][i]->smallest;
          if (vset_->icmp_.Compare(prev_end, this_begin) >= 0) {
            fprintf(stderr, "overlapping ranges in same level %s vs. %s\n",
                    prev_end.DebugString().c_str(),
                    this_begin.DebugString().c_str());
            abort();
          }
        }
      }
#endif
    }
  }